

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O1

void do_oprom_update_cold_10(void)

{
  char *pcVar1;
  char *pcVar2;
  uint in_ESI;
  uint in_EDI;
  undefined8 in_R9;
  
  pcVar1 = "DATA and CODE";
  pcVar2 = "DATA and CODE";
  if (in_EDI < 3) {
    pcVar2 = (&PTR_anon_var_dwarf_43_00116a90)[in_EDI];
  }
  if (in_ESI < 3) {
    pcVar1 = (&PTR_anon_var_dwarf_43_00116a90)[in_ESI];
  }
  fprintf(_stderr,"Error: Image type is %s expecting %s\n",pcVar2,pcVar1,&stderr,in_R9,
          &PTR_anon_var_dwarf_43_00116a90);
  return;
}

Assistant:

mockable_static
int oprom_update(const char *image_path,
                 struct igsc_device_handle *handle, struct igsc_device_info *dev_info,
                 enum igsc_oprom_type type, bool allow_downgrade)
{
    struct img *img = NULL;
    struct igsc_oprom_image *oimg = NULL;
    struct igsc_oprom_version dev_version;
    struct igsc_oprom_version img_version;
    igsc_progress_func_t progress_func = NULL;
    uint32_t img_type;
    uint8_t cmp;
    bool update = false;
    int ret;
    unsigned int retries;

    img = image_read_from_file(image_path);
    if (img == NULL)
    {
        ret = EXIT_FAILURE;
        fwupd_error("Failed to read: %s\n", image_path);
        goto exit;
    }

    ret = igsc_image_oprom_init(&oimg, img->blob, img->size);
    if (ret == IGSC_ERROR_BAD_IMAGE)
    {
        fwupd_error("Invalid image format: %s\n", image_path);
        ret = EXIT_FAILURE;
        goto exit;
    }

    if (ret != IGSC_SUCCESS)
    {
        fwupd_error("Failed to parse image: %s\n", image_path);
        ret = EXIT_FAILURE;
        goto exit;
    }

    ret = igsc_image_oprom_type(oimg, &img_type);
    if (ret != IGSC_SUCCESS)
    {
        fwupd_error("Failed to parse oprom type in image: %s\n",
                    image_path);
        goto exit;
    }

    if ((type & img_type) == 0)
    {
        fwupd_error("Image type is %s expecting %s\n",
                    oprom_type_to_str(img_type),
                    oprom_type_to_str(type));
        ret = EXIT_FAILURE;
        goto exit;
    }

    ret = igsc_image_oprom_version(oimg, type, &img_version);
    if (ret != IGSC_SUCCESS)
    {
        fwupd_error("Failed to get oprom version from image: %s\n", image_path);
        goto exit;
    }
    print_oprom_version(type, &img_version);

    retries = 0;
    while ((ret = igsc_device_oprom_version(handle, type, &dev_version)) == IGSC_ERROR_BUSY)
    {
        gsc_msleep(CONNECT_RETRIES_SLEEP_MSEC);
        if (++retries >= MAX_CONNECT_RETRIES)
            break;
    }

    if (ret != IGSC_SUCCESS)
    {
        if (ret == IGSC_ERROR_PERMISSION_DENIED)
        {
            fwupd_error("Permission denied: missing required credentials to access the device %s\n", dev_info->name);
        }
        else
        {
            fwupd_error("Cannot initialize device: %s\n", dev_info->name);
            print_device_fw_status(handle);
        }
        goto exit;
    }
    print_oprom_version(type, &dev_version);

    if (type == IGSC_OPROM_CODE)
    {
        /* Check devId enforcement for the case when 4ids extension exists and
         * for the case when the extension does not exist.
         * Note that in case of 2ids image and FW it will still work because the
         * 2ids FW will return that devId enforcement is disabled. */
        ret = oprom_check_devid_enforcement(handle, oimg);
        if (ret != IGSC_SUCCESS)
        {
            fwupd_error("Oprom code device enforcement failed: %d\n", ret);
            goto exit;
        }
    }

    ret = igsc_image_oprom_match_device(oimg, type, dev_info);
    if (ret == IGSC_ERROR_NOT_SUPPORTED)
    {
        fwupd_error("The image is not compatible with the device, check vid/did\n");
        goto exit;
    }
    else if (ret != IGSC_SUCCESS)
    {
        fwupd_error("Internal error: image to device match returned %d\n", ret);
        goto exit;
    }

    cmp = igsc_oprom_version_compare(&img_version, &dev_version);
    switch (cmp)
    {
    case IGSC_VERSION_NEWER:
        update = true;
        break;
    case IGSC_VERSION_OLDER:
        /* fall through */
    case IGSC_VERSION_EQUAL:
        fwupd_msg("Installed version is newer or equal\n");
        update = allow_downgrade;
        break;
    case IGSC_VERSION_NOT_COMPATIBLE:
        fwupd_error("OPROM version is not compatible with the installed one\n");
        ret = EXIT_FAILURE;
        goto exit;
    default:
        fwupd_error("OPROM version error in comparison\n");
        ret = EXIT_FAILURE;
        goto exit;
    }

    if (!update)
    {
        fwupd_msg("In order to update run with -a | --allow-downgrade\n");
        goto exit;
    }

    if (!quiet)
    {
        if (use_progress_bar)
        {
            progress_func = progress_bar_func;
        }
        else
        {
            progress_func = progress_percentage_func;
        }
    }

    ret = igsc_device_oprom_update(handle, type, oimg, progress_func, NULL);

    /* new line after progress bar */
    if (!quiet)
    {
        printf("\n");
    }
    if (ret)
    {
        fwupd_error("OPROM update failed ret = %d\n", ret);
        print_device_fw_status(handle);
    }

    ret = igsc_device_oprom_version(handle, type, &dev_version);
    if (ret != IGSC_SUCCESS)
    {
        fwupd_error("Failed to get oprom version after update\n");
        print_device_fw_status(handle);
        goto exit;
    }
    print_oprom_version(type, &dev_version);

    /* check the new version */
    if (memcmp(&dev_version, &img_version, sizeof(struct igsc_oprom_version)))
    {
        fwupd_error("After the update oprom %s version wasn't updated on the device\n",
                    oprom_type_to_str(type));
        ret = EXIT_FAILURE;
        goto exit;
    }

exit:
    igsc_image_oprom_release(oimg);
    free(img);

    return ret;
}